

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void lengthFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3_value *pVal;
  int iVar2;
  char *pcVar3;
  anon_union_8_5_44880d43_for_u aVar4;
  
  pVal = *argv;
  bVar1 = pVal->type;
  if (1 < bVar1 - 1) {
    if (bVar1 == 3) {
      pcVar3 = (char *)sqlite3ValueText(pVal,'\x01');
      if (pcVar3 == (char *)0x0) {
        return;
      }
      aVar4.i = 0;
      if (*pcVar3 != '\0') {
        do {
          pcVar3 = pcVar3 + 1;
          aVar4.nZero = aVar4.nZero + 1;
          aVar4.i._4_4_ = 0;
        } while (*pcVar3 != '\0');
        aVar4.i._4_4_ = 0;
      }
      goto LAB_00174c11;
    }
    if (bVar1 != 4) {
      sqlite3VdbeMemSetNull(&context->s);
      return;
    }
  }
  iVar2 = sqlite3ValueBytes(pVal,'\x01');
  aVar4 = (anon_union_8_5_44880d43_for_u)(long)iVar2;
LAB_00174c11:
  sqlite3VdbeMemRelease(&context->s);
  (context->s).u = aVar4;
  (context->s).flags = 4;
  (context->s).type = '\x01';
  return;
}

Assistant:

static void lengthFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int len;

  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  switch( sqlite3_value_type(argv[0]) ){
    case SQLITE_BLOB:
    case SQLITE_INTEGER:
    case SQLITE_FLOAT: {
      sqlite3_result_int(context, sqlite3_value_bytes(argv[0]));
      break;
    }
    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_value_text(argv[0]);
      if( z==0 ) return;
      len = 0;
      while( *z ){
        len++;
        SQLITE_SKIP_UTF8(z);
      }
      sqlite3_result_int(context, len);
      break;
    }
    default: {
      sqlite3_result_null(context);
      break;
    }
  }
}